

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_upto_overwrite_test(int opt)

{
  fdb_status fVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  ulong uVar7;
  fdb_config *pfVar8;
  long extraout_RDX;
  fdb_config *fconfig;
  uint uVar9;
  char *unaff_RBP;
  ulong uVar10;
  char *pcVar11;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar12;
  fdb_file_handle *fhandle;
  fdb_kvs_handle *unaff_R12;
  long lVar13;
  fdb_kvs_handle *unaff_R13;
  fdb_custom_cmp_variable p_Var14;
  undefined4 uVar15;
  undefined4 uVar16;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_file_handle *db_file;
  fdb_kvs_handle *db;
  uint64_t n_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap;
  char cmd [256];
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  char key [256];
  fdb_file_handle *pfStackY_d10;
  timeval tStackY_d08;
  fdb_config fStackY_cf8;
  code *pcStackY_c00;
  fdb_kvs_handle *pfStackY_bf8;
  fdb_kvs_handle *pfStackY_bf0;
  ulong uStackY_be8;
  fdb_kvs_handle *pfStackY_be0;
  fdb_kvs_config fStackY_bd8;
  timeval tStackY_bc0;
  char *pcStackY_bb0;
  char *pcStackY_ba8;
  fdb_kvs_handle *pfStackY_ba0;
  char *pcStackY_b98;
  char *pcStackY_b90;
  code *pcStackY_b88;
  fdb_file_handle *pfStackY_b78;
  int iStackY_b6c;
  fdb_kvs_handle *pfStackY_b68;
  fdb_kvs_handle *pfStackY_b60;
  fdb_kvs_handle *pfStackY_b58;
  fdb_kvs_handle *pfStackY_b50;
  fdb_kvs_handle *pfStackY_b48;
  undefined8 uStackY_b40;
  undefined8 uStackY_b38;
  undefined8 uStackY_b30;
  timeval tStackY_b20;
  fdb_kvs_config fStackY_b10;
  fdb_config fStackY_af8;
  char acStackY_a00 [256];
  char acStackY_900 [272];
  char *pcStackY_7f0;
  fdb_kvs_handle *pfStackY_7e8;
  char *pcStackY_7d8;
  code *pcStackY_7d0;
  fdb_snapshot_info_t *pfStackY_7c0;
  fdb_kvs_handle *pfStackY_7b8;
  uint64_t uStackY_7b0;
  timeval tStackY_7a8;
  size_t sStackY_798;
  fdb_kvs_handle **ppfStackY_790;
  code *pcStackY_788;
  fdb_kvs_handle *pfStackY_780;
  fdb_kvs_handle *pfStackY_778;
  fdb_kvs_handle *pfStackY_770;
  fdb_kvs_handle *pfStackY_768;
  undefined8 uStackY_760;
  undefined8 uStackY_758;
  fdb_kvs_handle *pfStackY_750;
  timeval tStackY_740;
  fdb_kvs_config fStackY_730;
  fdb_config fStackY_718;
  char acStackY_620 [256];
  fdb_kvs_handle *apfStackY_520 [33];
  fdb_config *pfStackY_418;
  fdb_kvs_handle *pfStackY_410;
  fdb_kvs_handle *pfStackY_408;
  char *pcStackY_400;
  fdb_kvs_handle *pfStackY_3f8;
  btree *pbStackY_3f0;
  fdb_iterator *local_3d8;
  int local_3cc;
  fdb_kvs_handle *local_3c8;
  fdb_file_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  char *local_3b0;
  int local_3a8;
  undefined4 uStack_3a4;
  fdb_snapshot_info_t *local_3a0;
  fdb_kvs_handle *local_398;
  fdb_kvs_handle *local_390;
  long local_388;
  fdb_kvs_config local_380;
  char local_368 [256];
  timeval local_268;
  undefined1 local_258 [304];
  fdb_config local_128;
  
  pfVar6 = (fdb_kvs_handle *)0x0;
  pbStackY_3f0 = (btree *)0x112af6;
  local_3cc = opt;
  gettimeofday(&local_268,(__timezone_ptr_t)0x0);
  builtin_strncpy(local_368,"rm -rf  compact_test* > errorlog.txt",0x25);
  pbStackY_3f0 = (btree *)0x112b26;
  system(local_368);
  pbStackY_3f0 = (btree *)0x112b2b;
  memleak_start();
  pbStackY_3f0 = (btree *)0x112b35;
  pcVar3 = (char *)malloc(0x20);
  fconfig = &local_128;
  pbStackY_3f0 = (btree *)0x112b48;
  fdb_get_default_config();
  local_128.seqtree_opt = '\x01';
  local_128.durability_opt = '\x02';
  local_128.wal_flush_before_commit = true;
  local_128.multi_kv_instances = true;
  local_128.buffercache_size = 0;
  local_128.block_reusing_threshold = 0;
  pbStackY_3f0 = (btree *)0x112b6b;
  fdb_get_default_kvs_config();
  pbStackY_3f0 = (btree *)0x112b7f;
  fVar1 = fdb_open(&local_3c0,"./compact_test",fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011317c;
  pbStackY_3f0 = (btree *)0x112ba2;
  fVar1 = fdb_kvs_open(local_3c0,&local_3b8,"db",&local_380);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113181;
  unaff_R12 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R12 >> 8),local_3cc == 0);
  local_3b0 = pcVar3 + 0x1a;
  unaff_R13 = (fdb_kvs_handle *)(local_258 + 0x30);
  unaff_RBP = local_258;
  fconfig = (fdb_config *)0x0;
  do {
    uVar9 = (uint)fconfig;
    pfVar8 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      pfVar8 = fconfig;
    }
    pbStackY_3f0 = (btree *)0x112bea;
    sprintf((char *)unaff_R13,"key%06d",pfVar8);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(local_3b0,"<end>",6);
    pfVar8 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      pcVar11 = "value%08d";
      pfVar8 = fconfig;
    }
    else {
      pcVar11 = "updated_value%08d";
    }
    pbStackY_3f0 = (btree *)0x112c2e;
    sprintf(pcVar3,pcVar11,pfVar8);
    pfVar6 = local_3b8;
    pbStackY_3f0 = (btree *)0x112c3b;
    sVar4 = strlen((char *)unaff_R13);
    pbStackY_3f0 = (btree *)0x112c53;
    fVar1 = fdb_set_kv(pfVar6,unaff_R13,sVar4 + 1,pcVar3,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113134;
    pfVar8 = fconfig;
    if (local_3cc == 3) {
LAB_00112c74:
      unaff_R12 = (fdb_kvs_handle *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (local_3cc == 2) {
      pfVar8 = (fdb_config *)CONCAT71((int7)((ulong)fconfig >> 8),~(byte)fconfig);
      goto LAB_00112c74;
    }
    pbStackY_3f0 = (btree *)0x112c86;
    fVar1 = fdb_commit(local_3c0,(fdb_commit_opt_t)unaff_R12);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113139;
    pbStackY_3f0 = (btree *)0x112c9b;
    fVar1 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)unaff_RBP);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011313e;
    fconfig = (fdb_config *)(ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 10);
  pbStackY_3f0 = (btree *)0x112cc2;
  fVar1 = fdb_get_all_snap_markers(local_3c0,&local_3a0,(uint64_t *)&local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113186;
  fconfig = (fdb_config *)(CONCAT44(uStack_3a4,local_3a8) >> 1);
  pbStackY_3f0 = (btree *)0x112cf3;
  fVar1 = fdb_compact_upto(local_3c0,"./compact_test2",local_3a0[(int)fconfig].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011318b;
  if (-1 < (int)(local_3a8 - 1U)) {
    unaff_R12 = (fdb_kvs_handle *)(ulong)(local_3a8 - 1U);
    local_388 = (long)(int)fconfig;
    fconfig = (fdb_config *)(local_258 + 0x30);
    do {
      pfVar6 = (fdb_kvs_handle *)(local_3a0[(long)unaff_R12].kvs_markers)->seqnum;
      pbStackY_3f0 = (btree *)0x112d3e;
      fVar1 = fdb_snapshot_open(local_3b8,&local_398,(fdb_seqnum_t)pfVar6);
      if (local_388 < (long)unaff_R12) {
        pfVar12 = unaff_R12;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011315e;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113163;
        pbStackY_3f0 = (btree *)0x112d7f;
        local_390 = unaff_R12;
        fVar1 = fdb_iterator_init(local_398,&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113168;
        pfVar6 = (fdb_kvs_handle *)((long)&pfVar6[-1].bub_ctx.handle + 3);
        unaff_R12 = (fdb_kvs_handle *)0x0;
        do {
          local_3c8 = (fdb_kvs_handle *)0x0;
          pbStackY_3f0 = (btree *)0x112da6;
          fVar1 = fdb_iterator_get(local_3d8,(fdb_doc **)&local_3c8);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pbStackY_3f0 = (btree *)0x112dc2;
          sprintf((char *)fconfig,"key%06d",(ulong)unaff_R12 & 0xffffffff);
          builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
          builtin_strncpy(local_3b0,"<end>",6);
          pcVar11 = "value%08d";
          if (unaff_R12 < pfVar6) {
            pcVar11 = "updated_value%08d";
          }
          pbStackY_3f0 = (btree *)0x112e05;
          sprintf(pcVar3,pcVar11,(ulong)unaff_R12 & 0xffffffff);
          unaff_R13 = local_3c8;
          unaff_RBP = (char *)local_3c8->op_stats;
          pbStackY_3f0 = (btree *)0x112e1d;
          iVar2 = bcmp(unaff_RBP,fconfig,*(size_t *)&local_3c8->kvs_config);
          if (iVar2 != 0) {
            pbStackY_3f0 = (btree *)0x113129;
            compact_upto_overwrite_test();
LAB_00113129:
            pbStackY_3f0 = (btree *)0x113134;
            compact_upto_overwrite_test();
            goto LAB_00113134;
          }
          unaff_RBP = (char *)(unaff_R13->field_6).seqtree;
          pbStackY_3f0 = (btree *)0x112e38;
          iVar2 = bcmp(unaff_RBP,pcVar3,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113129;
          unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
          pbStackY_3f0 = (btree *)0x112e4b;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pbStackY_3f0 = (btree *)0x112e55;
          fVar1 = fdb_iterator_next(local_3d8);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pbStackY_3f0 = (btree *)0x112e67;
        fVar1 = fdb_iterator_close(local_3d8);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
        if ((int)unaff_R12 != 5) goto LAB_00113177;
        pbStackY_3f0 = (btree *)0x112e83;
        fVar1 = fdb_kvs_close(local_398);
        unaff_R12 = local_390;
        pfVar12 = local_390;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113172;
      }
      unaff_R12 = (fdb_kvs_handle *)((long)&pfVar12[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar12);
  }
  pbStackY_3f0 = (btree *)0x112ec1;
  fVar1 = fdb_iterator_init(local_3b8,&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113190;
  unaff_R13 = (fdb_kvs_handle *)(local_258 + 0x30);
  unaff_RBP = "updated_value%08d";
  fconfig = (fdb_config *)0x0;
  do {
    local_3c8 = (fdb_kvs_handle *)0x0;
    pbStackY_3f0 = (btree *)0x112ef2;
    fVar1 = fdb_iterator_get(local_3d8,(fdb_doc **)&local_3c8);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pbStackY_3f0 = (btree *)0x112f0d;
    sprintf((char *)unaff_R13,"key%06d",fconfig);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(local_3b0,"<end>",6);
    pbStackY_3f0 = (btree *)0x112f3d;
    sprintf(pcVar3,"updated_value%08d",fconfig);
    pfVar6 = local_3c8;
    unaff_R12 = (fdb_kvs_handle *)local_3c8->op_stats;
    pbStackY_3f0 = (btree *)0x112f54;
    iVar2 = bcmp(unaff_R12,unaff_R13,*(size_t *)&local_3c8->kvs_config);
    if (iVar2 != 0) goto LAB_00113143;
    unaff_R12 = (fdb_kvs_handle *)(pfVar6->field_6).seqtree;
    pbStackY_3f0 = (btree *)0x112f6f;
    iVar2 = bcmp(unaff_R12,pcVar3,(size_t)(pfVar6->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_00113153;
    fconfig = (fdb_config *)(ulong)((int)fconfig + 1);
    pbStackY_3f0 = (btree *)0x112f81;
    fdb_doc_free((fdb_doc *)pfVar6);
    pbStackY_3f0 = (btree *)0x112f8b;
    fVar1 = fdb_iterator_next(local_3d8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pbStackY_3f0 = (btree *)0x112f9d;
  fVar1 = fdb_iterator_close(local_3d8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113195;
  if ((int)fconfig != 5) goto LAB_0011319a;
  pbStackY_3f0 = (btree *)0x112fbd;
  fVar1 = fdb_free_snap_markers(local_3a0,CONCAT44(uStack_3a4,local_3a8));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011319f;
  pbStackY_3f0 = (btree *)0x112fcd;
  free(pcVar3);
  pbStackY_3f0 = (btree *)0x112fd7;
  fVar1 = fdb_close(local_3c0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a4;
  pbStackY_3f0 = (btree *)0x112fe4;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a9;
  pbStackY_3f0 = (btree *)0x112ff1;
  memleak_end();
  builtin_strncpy(local_368 + 0x10,"rwrite test",0xc);
  builtin_strncpy(local_368,"compact upto ove",0x10);
  switch(local_3cc) {
  case 0:
    pbStackY_3f0 = (btree *)0x11303b;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4," (HB+trie)",0xb);
    break;
  case 1:
    pbStackY_3f0 = (btree *)0x1130bf;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4," (WAL)",7);
    break;
  case 2:
    pbStackY_3f0 = (btree *)0x113067;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4 + 0xe,"ie/WAL)",8);
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = 'H';
    uVar15._2_1_ = 'B';
    uVar15._3_1_ = '+';
    uVar16._0_1_ = 't';
    uVar16._1_1_ = 'r';
    uVar16._2_1_ = 'i';
    uVar16._3_1_ = 'e';
    goto LAB_001130a8;
  case 3:
    pbStackY_3f0 = (btree *)0x11308f;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4 + 0xe,"B+trie)",8);
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = 'W';
    uVar15._2_1_ = 'A';
    uVar15._3_1_ = 'L';
    uVar16._0_1_ = '/';
    uVar16._1_1_ = 'H';
    uVar16._2_1_ = 'B';
    uVar16._3_1_ = '+';
LAB_001130a8:
    pcVar3 = local_368 + sVar4;
    pcVar3[0] = ' ';
    pcVar3[1] = '(';
    pcVar3[2] = 'm';
    pcVar3[3] = 'i';
    pcVar3 = local_368 + sVar4 + 4;
    pcVar3[0] = 'x';
    pcVar3[1] = 'e';
    pcVar3[2] = 'd';
    pcVar3[3] = ',';
    *(undefined4 *)(local_368 + sVar4 + 8) = uVar15;
    *(undefined4 *)(local_368 + sVar4 + 0xc) = uVar16;
  }
  pcVar3 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar3 = "%s FAILED\n";
  }
  pbStackY_3f0 = (btree *)0x113107;
  fprintf(_stderr,pcVar3,local_368);
  return;
LAB_00113134:
  pbStackY_3f0 = (btree *)0x113139;
  compact_upto_overwrite_test();
LAB_00113139:
  pbStackY_3f0 = (btree *)0x11313e;
  compact_upto_overwrite_test();
LAB_0011313e:
  pbStackY_3f0 = (btree *)0x113143;
  compact_upto_overwrite_test();
LAB_00113143:
  pbStackY_3f0 = (btree *)0x113153;
  compact_upto_overwrite_test();
LAB_00113153:
  pbStackY_3f0 = (btree *)0x11315e;
  compact_upto_overwrite_test();
LAB_0011315e:
  pbStackY_3f0 = (btree *)0x113163;
  compact_upto_overwrite_test();
LAB_00113163:
  pbStackY_3f0 = (btree *)0x113168;
  compact_upto_overwrite_test();
LAB_00113168:
  pbStackY_3f0 = (btree *)0x11316d;
  compact_upto_overwrite_test();
LAB_0011316d:
  pbStackY_3f0 = (btree *)0x113172;
  compact_upto_overwrite_test();
LAB_00113172:
  pbStackY_3f0 = (btree *)0x113177;
  compact_upto_overwrite_test();
LAB_00113177:
  pbStackY_3f0 = (btree *)0x11317c;
  compact_upto_overwrite_test();
LAB_0011317c:
  pbStackY_3f0 = (btree *)0x113181;
  compact_upto_overwrite_test();
LAB_00113181:
  pbStackY_3f0 = (btree *)0x113186;
  compact_upto_overwrite_test();
LAB_00113186:
  pbStackY_3f0 = (btree *)0x11318b;
  compact_upto_overwrite_test();
LAB_0011318b:
  pbStackY_3f0 = (btree *)0x113190;
  compact_upto_overwrite_test();
LAB_00113190:
  pbStackY_3f0 = (btree *)0x113195;
  compact_upto_overwrite_test();
LAB_00113195:
  pbStackY_3f0 = (btree *)0x11319a;
  compact_upto_overwrite_test();
LAB_0011319a:
  pbStackY_3f0 = (btree *)0x11319f;
  compact_upto_overwrite_test();
LAB_0011319f:
  pbStackY_3f0 = (btree *)0x1131a4;
  compact_upto_overwrite_test();
LAB_001131a4:
  pbStackY_3f0 = (btree *)0x1131a9;
  compact_upto_overwrite_test();
LAB_001131a9:
  pbStackY_3f0 = (btree *)compact_with_snapshot_open_test;
  compact_upto_overwrite_test();
  pcStackY_788 = (code *)0x1131cb;
  pfStackY_418 = fconfig;
  pfStackY_410 = unaff_R12;
  pfStackY_408 = unaff_R13;
  pcStackY_400 = pcVar3;
  pfStackY_3f8 = pfVar6;
  pbStackY_3f0 = (btree *)unaff_RBP;
  gettimeofday(&tStackY_740,(__timezone_ptr_t)0x0);
  pcStackY_788 = (code *)0x1131d0;
  memleak_start();
  pcStackY_788 = (code *)0x1131dd;
  fdb_get_default_config();
  pcStackY_788 = (code *)0x1131ea;
  fdb_get_default_kvs_config();
  fStackY_718.compaction_cb_ctx = &uStackY_760;
  uStackY_760 = 0;
  uStackY_758 = 0;
  pfStackY_750 = (fdb_kvs_handle *)0x0;
  fStackY_718.wal_threshold = 0x400;
  fStackY_718.flags = 1;
  fStackY_718.compaction_cb = compaction_cb_get;
  fStackY_718.compaction_cb_mask = 0x1b;
  pcStackY_788 = (code *)0x113230;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStackY_788 = (code *)0x113245;
  fdb_open((fdb_file_handle **)&pfStackY_780,"./compact_test1",&fStackY_718);
  pcStackY_788 = (code *)0x11325f;
  fdb_kvs_open((fdb_file_handle *)pfStackY_780,&pfStackY_768,"db",&fStackY_730);
  pcStackY_788 = (code *)0x113272;
  fdb_kvs_open((fdb_file_handle *)pfStackY_780,&pfStackY_778,"db",&fStackY_730);
  uVar7 = 0;
  do {
    pcStackY_788 = (code *)0x11329e;
    sprintf((char *)apfStackY_520,"key%04d",uVar7);
    pcStackY_788 = (code *)0x1132ad;
    sprintf(acStackY_620,"body%04d",uVar7);
    pfVar6 = pfStackY_768;
    pcStackY_788 = (code *)0x1132ba;
    sVar4 = strlen((char *)apfStackY_520);
    pcStackY_788 = (code *)0x1132c5;
    sVar5 = strlen(acStackY_620);
    pcStackY_788 = (code *)0x1132d9;
    ptr_handle = apfStackY_520;
    pfVar12 = pfVar6;
    fVar1 = fdb_set_kv(pfVar6,apfStackY_520,sVar4,acStackY_620,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_788 = (code *)0x11339e;
      compact_with_snapshot_open_test();
      goto LAB_0011339e;
    }
    uVar9 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar9;
  } while (uVar9 != 100000);
  ptr_handle = (fdb_kvs_handle **)0x1;
  pcStackY_788 = (code *)0x1132f9;
  pfVar12 = pfStackY_780;
  fVar1 = fdb_commit((fdb_file_handle *)pfStackY_780,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_750 = pfStackY_778;
    ptr_handle = (fdb_kvs_handle **)0x0;
    pcStackY_788 = (code *)0x113316;
    pfVar12 = pfStackY_780;
    fVar1 = fdb_compact((fdb_file_handle *)pfStackY_780,(char *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
    ptr_handle = &pfStackY_770;
    pcStackY_788 = (code *)0x113332;
    pfVar12 = pfStackY_778;
    fVar1 = fdb_snapshot_open(pfStackY_778,ptr_handle,100000);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
    pcStackY_788 = (code *)0x113340;
    fdb_kvs_close(pfStackY_770);
    pcStackY_788 = (code *)0x113349;
    fVar1 = fdb_close((fdb_file_handle *)pfStackY_780);
    pfVar12 = pfStackY_780;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
    pcStackY_788 = (code *)0x113352;
    fVar1 = fdb_shutdown();
    pfVar12 = pfStackY_780;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar3 = "%s PASSED\n";
      if (compact_with_snapshot_open_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      pcStackY_788 = (code *)0x113387;
      fprintf(_stderr,pcVar3,"compact with snapshot_open test");
      return;
    }
  }
  else {
LAB_0011339e:
    pcStackY_788 = (code *)0x1133a3;
    compact_with_snapshot_open_test();
LAB_001133a3:
    pcStackY_788 = (code *)0x1133a8;
    compact_with_snapshot_open_test();
LAB_001133a8:
    pcStackY_788 = (code *)0x1133ad;
    compact_with_snapshot_open_test();
LAB_001133ad:
    pcStackY_788 = (code *)0x1133b2;
    compact_with_snapshot_open_test();
  }
  pcStackY_788 = compaction_cb_get;
  compact_with_snapshot_open_test();
  pcStackY_7d0 = (code *)0x1133d3;
  sStackY_798 = sVar4;
  ppfStackY_790 = apfStackY_520;
  pcStackY_788 = (code *)uVar7;
  gettimeofday(&tStackY_7a8,(__timezone_ptr_t)0x0);
  if ((int)ptr_handle == 2) {
    if (extraout_RDX == 0) {
      pcStackY_7d0 = (code *)0x1133e2;
      compaction_cb_get();
      goto LAB_001133e2;
    }
  }
  else {
LAB_001133e2:
    if (extraout_RDX != 0) goto LAB_00113449;
  }
  pcStackY_7d0 = (code *)0x1133f9;
  fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar12,&pfStackY_7c0,&uStackY_7b0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStackY_7d0 = (code *)0x11341d;
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_778->kvs_config).custom_cmp_param,
                              &pfStackY_7b8,pfStackY_7c0->kvs_markers->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
    pcStackY_7d0 = (code *)0x11342b;
    fVar1 = fdb_kvs_close(pfStackY_7b8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      return;
    }
  }
  else {
    pcStackY_7d0 = (code *)0x11343f;
    compaction_cb_get();
LAB_0011343f:
    pcStackY_7d0 = (code *)0x113444;
    compaction_cb_get();
  }
  pcStackY_7d0 = (code *)0x113449;
  compaction_cb_get();
LAB_00113449:
  pcStackY_7d0 = compact_with_snapshot_open_multi_kvs_test;
  compaction_cb_get();
  pcStackY_7d8 = "body%04d";
  pfStackY_7e8 = pfVar6;
  pcStackY_b88 = (code *)0x11346b;
  pcStackY_7f0 = acStackY_620;
  pcStackY_7d0 = (code *)((ulong)ptr_handle & 0xffffffff);
  gettimeofday(&tStackY_b20,(__timezone_ptr_t)0x0);
  pcStackY_b88 = (code *)0x113470;
  memleak_start();
  pcStackY_b88 = (code *)0x113480;
  fdb_get_default_config();
  pcStackY_b88 = (code *)0x11348d;
  fdb_get_default_kvs_config();
  fStackY_af8.compaction_cb_ctx = &uStackY_b40;
  uStackY_b40 = 0;
  uStackY_b38 = 0;
  uStackY_b30 = 0;
  fStackY_af8.wal_threshold = 0x400;
  fStackY_af8.flags = 1;
  fStackY_af8.compaction_cb = compaction_cb_markers;
  fStackY_af8.compaction_cb_mask = 0x1b;
  pcStackY_b88 = (code *)0x1134d3;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStackY_b88 = (code *)0x1134ea;
  fdb_open(&pfStackY_b78,"./compact_test1",&fStackY_af8);
  pcStackY_b88 = (code *)0x113501;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b48,"db1",&fStackY_b10);
  pcStackY_b88 = (code *)0x113518;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b50,"db2",&fStackY_b10);
  pcStackY_b88 = (code *)0x11352f;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b58,"db3",&fStackY_b10);
  pcStackY_b88 = (code *)0x113546;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b60,"db4",&fStackY_b10);
  pcStackY_b88 = (code *)0x11355d;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b68,"db5",&fStackY_b10);
  uVar7 = 0;
  do {
    iVar2 = (int)uVar7;
    if (iVar2 == 5) goto LAB_001136e1;
    uVar7 = 0;
    iStackY_b6c = iVar2;
    do {
      pcStackY_b88 = (code *)0x11359b;
      sprintf(acStackY_900,"key%04d",uVar7);
      pcStackY_b88 = (code *)0x1135aa;
      sprintf(acStackY_a00,"body%04d",uVar7);
      pfVar6 = pfStackY_b48;
      pcStackY_b88 = (code *)0x1135b7;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x1135c5;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x1135d9;
      fdb_set_kv(pfVar6,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar6 = pfStackY_b50;
      pcStackY_b88 = (code *)0x1135e6;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x1135f1;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113605;
      fdb_set_kv(pfVar6,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar6 = pfStackY_b58;
      pcStackY_b88 = (code *)0x113612;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x11361d;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113631;
      fdb_set_kv(pfVar6,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar6 = pfStackY_b60;
      pcStackY_b88 = (code *)0x11363e;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x113649;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x11365d;
      fdb_set_kv(pfVar6,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar12 = pfStackY_b68;
      pcStackY_b88 = (code *)0x11366a;
      pfVar6 = (fdb_kvs_handle *)strlen(acStackY_900);
      pcStackY_b88 = (code *)0x113675;
      sVar4 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113693;
      fdb_set_kv(pfVar12,acStackY_900,(size_t)pfVar6,acStackY_a00,sVar4);
      uVar9 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar9;
    } while (uVar9 != 1000);
    pcStackY_b88 = (code *)0x1136b0;
    fhandle = pfStackY_b78;
    fVar1 = fdb_commit(pfStackY_b78,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_b88 = (code *)0x113740;
      compact_with_snapshot_open_multi_kvs_test();
      goto LAB_00113740;
    }
    uVar7 = (ulong)(iStackY_b6c + 1U);
    uStackY_b40 = CONCAT44(uStackY_b40._4_4_,(iStackY_b6c + 1U) * 1000);
    pcStackY_b88 = (code *)0x1136d4;
    fVar1 = fdb_compact(pfStackY_b78,(char *)0x0);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pcStackY_b88 = (code *)0x1136e1;
  compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
  pcStackY_b88 = (code *)0x1136eb;
  fhandle = pfStackY_b78;
  fVar1 = fdb_close(pfStackY_b78);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStackY_b88 = (code *)0x1136f4;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar3 = "%s PASSED\n";
      if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      pcStackY_b88 = (code *)0x113729;
      fprintf(_stderr,pcVar3,"compact with snapshot_open multi kvs test");
      return;
    }
  }
  else {
LAB_00113740:
    pcStackY_b88 = (code *)0x113745;
    compact_with_snapshot_open_multi_kvs_test();
  }
  pcStackY_b88 = compaction_cb_markers;
  compact_with_snapshot_open_multi_kvs_test();
  pcStackY_b90 = "body%04d";
  pcStackY_bb0 = "key%04d";
  pcStackY_c00 = (code *)0x11376f;
  pcStackY_ba8 = acStackY_a00;
  pfStackY_ba0 = pfVar6;
  pcStackY_b98 = acStackY_900;
  pcStackY_b88 = (code *)uVar7;
  gettimeofday(&tStackY_bc0,(__timezone_ptr_t)0x0);
  pcStackY_c00 = (code *)0x113779;
  fdb_get_default_kvs_config();
  iVar2 = *(int *)&pfStackY_b78->root;
  pcStackY_c00 = (code *)0x11378c;
  fVar1 = fdb_get_all_snap_markers(fhandle,(fdb_snapshot_info_t **)&pfStackY_bf8,&uStackY_be8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar6 = pfStackY_bf8;
    if ((pfStackY_bf8->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
      pcStackY_c00 = (code *)0x113870;
      compaction_cb_markers();
      pfVar6 = pfStackY_bf0;
    }
    if (*(fdb_seqnum_t *)((long)(pfVar6->kvs_config).custom_cmp_param + 8) == (long)iVar2) {
      if (uStackY_be8 != 0) {
        uVar10 = 0;
        uVar7 = uStackY_be8;
        do {
          if ((&pfVar6->kvs_config)[uVar10].custom_cmp != (fdb_custom_cmp_variable)0x0) {
            lVar13 = 0;
            p_Var14 = (fdb_custom_cmp_variable)0x0;
            do {
              pcVar3 = *(char **)((long)(&pfVar6->kvs_config)[uVar10].custom_cmp_param + lVar13);
              if (pcVar3 != (char *)0x0) {
                pcStackY_c00 = (code *)0x1137fa;
                fdb_kvs_open(fhandle,&pfStackY_bf0,pcVar3,&fStackY_bd8);
                pcStackY_c00 = (code *)0x11380c;
                fVar1 = fdb_snapshot_open(pfStackY_bf0,&pfStackY_be0,(long)iVar2);
                if (fVar1 == FDB_RESULT_SUCCESS) {
                  pcStackY_c00 = (code *)0x11381a;
                  fVar1 = fdb_kvs_close(pfStackY_be0);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    pcStackY_c00 = (code *)0x11387d;
                    compaction_cb_markers();
                    goto LAB_0011387d;
                  }
                  pcStackY_c00 = (code *)0x113828;
                  fVar1 = fdb_kvs_close(pfStackY_bf0);
                  pfVar6 = pfStackY_bf8;
                  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                }
                else {
LAB_0011387d:
                  pcStackY_c00 = (code *)0x113882;
                  compaction_cb_markers();
                }
                pcStackY_c00 = (code *)0x113887;
                compaction_cb_markers();
                goto LAB_00113887;
              }
LAB_00113830:
              p_Var14 = p_Var14 + 1;
              lVar13 = lVar13 + 0x10;
              uVar7 = uStackY_be8;
            } while (p_Var14 < (&pfVar6->kvs_config)[uVar10].custom_cmp);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar7);
      }
      return;
    }
  }
  else {
LAB_00113887:
    pcStackY_c00 = (code *)0x11388c;
    compaction_cb_markers();
  }
  pcStackY_c00 = db_compact_during_compaction_cancellation;
  compaction_cb_markers();
  gettimeofday(&tStackY_d08,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fStackY_cf8.compaction_cb = cb_cancel_test;
  fStackY_cf8.compaction_cb_ctx = (void *)0x0;
  fStackY_cf8.compaction_cb_mask = 0x11;
  fVar1 = fdb_open(&pfStackY_d10,"compact_test",&fStackY_cf8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar1 = fdb_compact(pfStackY_d10,(char *)0x0);
  if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(pfStackY_d10);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void compact_upto_overwrite_test(int opt)
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx, c;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d";
    char valuestr2[] = "updated_value%08d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    fdb_kvs_info kvs_info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t seqnum;
    fdb_commit_opt_t commit_opt;
    uint64_t n_markers;

    sprintf(cmd, SHELL_DEL " compact_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.block_reusing_threshold = 0;

    commit_opt = (opt)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<n;++i){
        idx = i % (n/2);
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        if (i < (n/2)) {
            sprintf(value, valuestr, idx);
        } else {
            sprintf(value, valuestr2, idx);
        }
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        if (opt == 2) {
            // HB+trie, WAL, HB+trie, WAL...
            commit_opt = (i%2)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;
        } else if (opt == 3) {
            // WAL, HB+trie, WAL, HB+trie...
            commit_opt = (i%2)?FDB_COMMIT_MANUAL_WAL_FLUSH:FDB_COMMIT_NORMAL;
        }

        s = fdb_commit(db_file, commit_opt);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_get_all_snap_markers(db_file, &markers, &n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    int upto = n_markers/2;
    s = fdb_compact_upto(db_file, "./compact_test2", markers[upto].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // iterating using snapshots with various seqnums
    for (i=n_markers-1; i>=0; --i) {
        seqnum = markers[i].kvs_markers->seqnum;

        s = fdb_snapshot_open(db, &snap, seqnum);
        if (i<=upto) {
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        } else {
            // seqnum < (n/2) must fail
            TEST_CHK(s != FDB_RESULT_SUCCESS);
            continue;
        }

        s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        c = 0;
        do {
            doc = NULL;
            s = fdb_iterator_get(fit, &doc);
            if (s != FDB_RESULT_SUCCESS) break;
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            if ((fdb_seqnum_t)c >= seqnum-(n/2)) {
                sprintf(value, valuestr, idx);
            } else {
                sprintf(value, valuestr2, idx);
            }
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
            c++;
            fdb_doc_free(doc);
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        s = fdb_iterator_close(fit);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(c == (n/2));

        s = fdb_kvs_close(snap);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // iterating using the original handle
    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) break;
        idx = c;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr2, idx);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        c++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(c == (n/2));

    s = fdb_free_snap_markers(markers, n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(cmd, "compact upto overwrite test");
    if (opt == 0) {
        strcat(cmd, " (HB+trie)");
    } else if (opt == 1) {
        strcat(cmd, " (WAL)");
    } else if (opt == 2) {
        strcat(cmd, " (mixed, HB+trie/WAL)");
    } else if (opt == 3) {
        strcat(cmd, " (mixed, WAL/HB+trie)");
    }
    TEST_RESULT(cmd);
}